

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_lower_bounds.cpp
# Opt level: O2

ValuedAction __thiscall
despot::POMCPScenarioLowerBound::Value
          (POMCPScenarioLowerBound *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  POMCPPrior *pPVar1;
  pointer ppSVar2;
  DSPOMDP *pDVar3;
  int iVar4;
  VNode *vnode;
  undefined4 extraout_var;
  int i;
  ulong uVar5;
  double dVar6;
  ValuedAction VVar7;
  ValuedAction VVar8;
  History local_60;
  
  pPVar1 = this->prior_;
  History::History(&local_60,history);
  (*pPVar1->_vptr_POMCPPrior[5])(pPVar1,&local_60);
  History::~History(&local_60);
  uVar5 = 0;
  vnode = POMCP::CreateVNode(0,*(particles->
                                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                )._M_impl.super__Vector_impl_data._M_start,this->prior_,
                             (this->super_ScenarioLowerBound).model_);
  while( true ) {
    ppSVar2 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(particles->
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3) <= uVar5) break;
    pDVar3 = (this->super_ScenarioLowerBound).model_;
    iVar4 = (*pDVar3->_vptr_DSPOMDP[0x16])(pDVar3,ppSVar2[uVar5]);
    POMCP::Simulate((State *)CONCAT44(extraout_var,iVar4),streams,vnode,
                    (this->super_ScenarioLowerBound).model_,this->prior_);
    pDVar3 = (this->super_ScenarioLowerBound).model_;
    (*pDVar3->_vptr_DSPOMDP[0x17])(pDVar3,(State *)CONCAT44(extraout_var,iVar4));
    uVar5 = uVar5 + 1;
  }
  VVar7 = POMCP::OptimalAction(vnode);
  VVar8.action = VVar7.action;
  dVar6 = State::Weight(particles);
  if (vnode != (VNode *)0x0) {
    VNode::~VNode(vnode);
  }
  operator_delete(vnode,0x98);
  VVar8._4_4_ = 0;
  VVar8.value = VVar7.value * dVar6;
  return VVar8;
}

Assistant:

ValuedAction POMCPScenarioLowerBound::Value(const vector<State*>& particles,
	RandomStreams& streams, History& history) const {
	prior_->history(history);
	VNode* root = POMCP::CreateVNode(0, particles[0], prior_, model_);
	// Note that particles are assumed to be of equal weight
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		State* copy = model_->Copy(particle);
		POMCP::Simulate(copy, streams, root, model_, prior_);
		model_->Free(copy);
	}

	ValuedAction va = POMCP::OptimalAction(root);
	va.value *= State::Weight(particles);
	delete root;
	return va;
}